

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_> *
Jinx::Impl::ReplaceUtf8CharsAtRange
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
           *__return_storage_ptr__,String *dest,String *source,pair<long,_long> *range)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  pointer utf8Str;
  long lVar4;
  char *utf8Str_00;
  pointer pcVar5;
  char *pcVar6;
  bool bVar7;
  String out;
  
  if (range->second < range->first) {
    LogWriteLine(Error,"First range index is greater than second");
  }
  else {
    utf8Str_00 = (dest->_M_dataplus)._M_p;
    pcVar6 = utf8Str_00 + dest->_M_string_length;
    pcVar1 = GetUtf8CstrByIndex(dest,range->first);
    pcVar2 = GetUtf8CstrByIndex(dest,range->second);
    if ((pcVar1 != (char *)0x0) && (pcVar2 != (char *)0x0)) {
      out._M_dataplus._M_p = (pointer)&out.field_2;
      out._M_string_length = 0;
      out.field_2._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
                (&out,dest->_M_string_length);
      while (utf8Str_00 < pcVar6) {
        if (utf8Str_00 == pcVar1) {
          utf8Str = (source->_M_dataplus)._M_p;
          pcVar5 = utf8Str + source->_M_string_length;
          while (utf8Str < pcVar5) {
            sVar3 = GetUtf8CharSize(utf8Str);
            while (bVar7 = sVar3 != 0, sVar3 = sVar3 - 1, bVar7) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              push_back(&out,*utf8Str);
              utf8Str = utf8Str + 1;
            }
          }
          lVar4 = (range->second - range->first) + 1;
          while (bVar7 = lVar4 != 0, lVar4 = lVar4 + -1, bVar7) {
            sVar3 = GetUtf8CharSize(utf8Str_00);
            utf8Str_00 = utf8Str_00 + sVar3;
          }
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          push_back(&out,*utf8Str_00);
          utf8Str_00 = utf8Str_00 + 1;
        }
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true>
                (__return_storage_ptr__,&out);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&out);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
  ._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

inline_t std::optional<String> ReplaceUtf8CharsAtRange(const String & dest, const String & source, const std::pair<int64_t, int64_t> & range)
	{
		if (range.first > range.second)
		{
			LogWriteLine(LogLevel::Error, "First range index is greater than second");
			return std::optional<String>();
		}
		const char * destStart = dest.c_str();
		const char * destEnd = destStart + dest.size();
		const char * targetStart = GetUtf8CstrByIndex(dest, range.first);
		const char * targetEnd = GetUtf8CstrByIndex(dest, range.second);
		if (targetStart == nullptr || targetEnd == nullptr)
			return std::optional<String>();
		String out;
		out.reserve(dest.size());
		const char * destCurr = destStart;
		while (destCurr < destEnd)
		{
			if (destCurr == targetStart)
			{
				const char * srcCurr = source.c_str();
				const char * srcEnd = srcCurr + source.size();
				while (srcCurr < srcEnd)
				{
					size_t charCount = GetUtf8CharSize(srcCurr);
					for (size_t i = 0; i < charCount; ++i)
					{
						out += *srcCurr;
						++srcCurr;
					}
				}
				size_t rangeCount = range.second - range.first + 1;
				for (size_t i = 0; i < rangeCount; ++i)
				{
					size_t size = GetUtf8CharSize(destCurr);
					destCurr += size;
				}
			}
			else
			{
				out += *destCurr;
				++destCurr;
			}
		}
		return out;
	}